

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_send(int sock,void *data,size_t len,isobusfs_buf_log *isobusfs_tx_buffer)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  isobusfs_buf_log *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  uint __errnum;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_4;
  
  isobufs_store_tx_data
            (in_RCX,(uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  sVar1 = send(in_EDI,in_RSI,in_RDX,0x40);
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    __errnum = -*piVar2;
    local_4 = __errnum;
    pcVar3 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send data: %i (%s)",(ulong)__errnum,pcVar3);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int isobusfs_send(int sock, const void *data, size_t len,
		  struct isobusfs_buf_log *isobusfs_tx_buffer)
{
	int ret;

	/* store to tx buffer */
	isobufs_store_tx_data(isobusfs_tx_buffer, (uint8_t *)data);

	ret = send(sock, data, len, MSG_DONTWAIT);
	if (ret == -1) {
		ret = -errno;
		pr_warn("failed to send data: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}